

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

void Amap_ManCleanData(Amap_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_1c;
  int i;
  Amap_Obj_t *pObj;
  Amap_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
    if (pvVar2 != (void *)0x0) {
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    }
  }
  return;
}

Assistant:

void Amap_ManCleanData( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i;
//    Amap_ManForEachNode( p, pObj, i )
//        ABC_FREE( pObj->pData );
    Amap_ManForEachObj( p, pObj, i )
        pObj->pData = NULL;
}